

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QModelIndex,int>>::emplace<std::pair<QModelIndex,int>const&>
          (QMovableArrayOps<std::pair<QModelIndex,int>> *this,qsizetype i,
          pair<QModelIndex,_int> *args)

{
  undefined8 *puVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  quintptr qVar11;
  QAbstractItemModel *pQVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  qsizetype qVar15;
  long in_FS_OFFSET;
  Inserter local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this == (int *)0x0) || (1 < **(int **)this)) goto LAB_0054b501;
  if (*(long *)(this + 0x10) == i) {
    qVar15 = QArrayDataPointer<std::pair<QModelIndex,_int>_>::freeSpaceAtEnd
                       ((QArrayDataPointer<std::pair<QModelIndex,_int>_> *)this);
    if (qVar15 == 0) goto LAB_0054b4f8;
    lVar9 = *(long *)(this + 8);
    lVar10 = *(long *)(this + 0x10);
    uVar13 = *(undefined8 *)&args->first;
    qVar11 = (args->first).i;
    uVar14 = *(undefined8 *)&args->second;
    puVar1 = (undefined8 *)(lVar9 + 0x10 + lVar10 * 0x20);
    *puVar1 = (args->first).m.ptr;
    puVar1[1] = uVar14;
    puVar1 = (undefined8 *)(lVar9 + lVar10 * 0x20);
    *puVar1 = uVar13;
    puVar1[1] = qVar11;
  }
  else {
LAB_0054b4f8:
    if (i == 0) {
      qVar15 = QArrayDataPointer<std::pair<QModelIndex,_int>_>::freeSpaceAtBegin
                         ((QArrayDataPointer<std::pair<QModelIndex,_int>_> *)this);
      if (qVar15 == 0) goto LAB_0054b501;
      lVar9 = *(long *)(this + 8);
      uVar13 = *(undefined8 *)&args->first;
      qVar11 = (args->first).i;
      uVar14 = *(undefined8 *)&args->second;
      *(QAbstractItemModel **)(lVar9 + -0x10) = (args->first).m.ptr;
      *(undefined8 *)(lVar9 + -8) = uVar14;
      *(undefined8 *)(lVar9 + -0x20) = uVar13;
      *(quintptr *)(lVar9 + -0x18) = qVar11;
    }
    else {
LAB_0054b501:
      iVar6 = (args->first).r;
      iVar7 = (args->first).c;
      qVar11 = (args->first).i;
      pQVar12 = (args->first).m.ptr;
      iVar8 = args->second;
      uVar2 = args->field_0x1c;
      uVar3 = args->field_0x1d;
      uVar4 = args->field_0x1e;
      uVar5 = args->field_0x1f;
      lVar9 = *(long *)(this + 0x10);
      QArrayDataPointer<std::pair<QModelIndex,_int>_>::detachAndGrow
                ((QArrayDataPointer<std::pair<QModelIndex,_int>_> *)this,
                 (uint)(i == 0 && lVar9 != 0),1,(pair<QModelIndex,_int> **)0x0,
                 (QArrayDataPointer<std::pair<QModelIndex,_int>_> *)0x0);
      if (i != 0 || lVar9 == 0) {
        QMovableArrayOps<std::pair<QModelIndex,_int>_>::Inserter::Inserter
                  (&local_60,(QArrayDataPointer<std::pair<QModelIndex,_int>_> *)this,i,1);
        ((local_60.displaceFrom)->first).r = iVar6;
        ((local_60.displaceFrom)->first).c = iVar7;
        ((local_60.displaceFrom)->first).i = qVar11;
        ((local_60.displaceFrom)->first).m.ptr = pQVar12;
        (local_60.displaceFrom)->second = iVar8;
        (local_60.displaceFrom)->field_0x1c = uVar2;
        (local_60.displaceFrom)->field_0x1d = uVar3;
        (local_60.displaceFrom)->field_0x1e = uVar4;
        (local_60.displaceFrom)->field_0x1f = uVar5;
        (local_60.data)->size = (local_60.data)->size + local_60.nInserts;
        goto LAB_0054b613;
      }
      lVar9 = *(long *)(this + 8);
      *(int *)(lVar9 + -0x20) = iVar6;
      *(int *)(lVar9 + -0x1c) = iVar7;
      *(quintptr *)(lVar9 + -0x18) = qVar11;
      *(QAbstractItemModel **)(lVar9 + -0x10) = pQVar12;
      *(int *)(lVar9 + -8) = iVar8;
      *(undefined1 *)(lVar9 + -4) = uVar2;
      *(undefined1 *)(lVar9 + -3) = uVar3;
      *(undefined1 *)(lVar9 + -2) = uVar4;
      *(undefined1 *)(lVar9 + -1) = uVar5;
    }
    *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
  }
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
LAB_0054b613:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }